

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemeditorfactory.cpp
# Opt level: O3

void __thiscall QExpandingLineEdit::resizeToContents(QExpandingLineEdit *this)

{
  long lVar1;
  int *piVar2;
  int iVar3;
  LayoutDirection LVar4;
  int iVar5;
  QPoint QVar6;
  QSize QVar7;
  int iVar8;
  int iVar9;
  int w;
  long in_FS_OFFSET;
  Representation local_68;
  undefined1 local_58 [24];
  QFontMetrics local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar9 = (*(int *)(*(long *)(this + 0x20) + 0x1c) - *(int *)(*(long *)(this + 0x20) + 0x14)) + 1;
  if (*(int *)(this + 0x28) == -1) {
    *(int *)(this + 0x28) = iVar9;
  }
  lVar1 = *(long *)(*(long *)(this + 8) + 0x10);
  if (lVar1 != 0) {
    QVar6 = QWidget::pos((QWidget *)this);
    QVar7 = QWidget::minimumSize((QWidget *)this);
    QFontMetrics::QFontMetrics(local_40,(QFont *)(*(long *)(this + 0x20) + 0x38));
    QLineEdit::displayText((QString *)local_58,(QLineEdit *)this);
    iVar3 = QFontMetrics::horizontalAdvance((QString *)local_40,(int)(QString *)local_58);
    local_68 = QVar7.wd.m_i;
    iVar3 = iVar3 + local_68.m_i;
    piVar2 = (int *)CONCAT44(local_58._4_4_,local_58._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_58._4_4_,local_58._0_4_),2,0x10);
      }
    }
    QFontMetrics::~QFontMetrics(local_40);
    lVar1 = *(long *)(lVar1 + 0x20);
    iVar5 = *(int *)(lVar1 + 0x1c);
    iVar8 = *(int *)(lVar1 + 0x14);
    LVar4 = QWidget::layoutDirection((QWidget *)this);
    iVar9 = iVar9 + QVar6.xp.m_i.m_i;
    iVar5 = (iVar5 + 1) - (iVar8 + QVar6.xp.m_i.m_i);
    if (LVar4 == RightToLeft) {
      iVar5 = iVar9;
    }
    iVar8 = iVar3;
    if (iVar5 < iVar3) {
      iVar8 = iVar5;
    }
    w = *(int *)(this + 0x28);
    if (*(int *)(this + 0x28) < iVar8) {
      w = iVar3;
    }
    if (iVar5 <= w) {
      w = iVar5;
    }
    if (this[0x2c] == (QExpandingLineEdit)0x1) {
      QWidget::setMaximumWidth((QWidget *)this,w);
    }
    LVar4 = QWidget::layoutDirection((QWidget *)this);
    if (LVar4 == RightToLeft) {
      local_58._0_4_ = iVar9 - w;
      local_58._4_4_ = QVar6.yp.m_i;
      QWidget::move((QWidget *)this,(QPoint *)local_58);
    }
    local_58._4_4_ =
         (*(int *)(*(long *)(this + 0x20) + 0x20) - *(int *)(*(long *)(this + 0x20) + 0x18)) + 1;
    local_58._0_4_ = w;
    QWidget::resize((QWidget *)this,(QSize *)local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QExpandingLineEdit::resizeToContents()
{
    int oldWidth = width();
    if (originalWidth == -1)
        originalWidth = oldWidth;
    if (QWidget *parent = parentWidget()) {
        QPoint position = pos();
        int hintWidth = minimumWidth() + fontMetrics().horizontalAdvance(displayText());
        int parentWidth = parent->width();
        int maxWidth = isRightToLeft() ? position.x() + oldWidth : parentWidth - position.x();
        int newWidth = qBound(qMin(originalWidth, maxWidth), hintWidth, maxWidth);
        if (widgetOwnsGeometry)
            setMaximumWidth(newWidth);
        if (isRightToLeft())
            move(position.x() - newWidth + oldWidth, position.y());
        resize(newWidth, height());
    }
}